

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_arrayreverse(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQObjectType SVar3;
  uint uVar4;
  SQOuter *pSVar5;
  ulong uVar6;
  SQObjectValue SVar7;
  SQObjectPtr *pSVar8;
  long *plVar9;
  uint uVar10;
  SQDelegable *pSVar11;
  bool bVar12;
  SQRESULT SVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  SQObjectPtr t;
  SQObjectPtr *o;
  SQObjectPtr local_38;
  SQObjectPtr *local_28;
  
  if (v->_stackbase < v->_top) {
    bVar12 = sq_aux_gettypedarg(v,idx,OT_ARRAY,&local_28);
    SVar13 = -1;
    if (bVar12) {
      pSVar5 = (local_28->super_SQObject)._unVal.pOuter;
      uVar6 = pSVar5->_idx;
      if (0 < (long)uVar6) {
        local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
        local_38.super_SQObject._type = OT_NULL;
        if (uVar6 != 1) {
          lVar16 = (uVar6 >> 1) + (ulong)(uVar6 >> 1 == 0);
          lVar15 = uVar6 * 0x10 + -8;
          lVar14 = 8;
          do {
            SVar7 = (SQObjectValue)
                    ((SQObjectValue *)((long)&(pSVar5->_valptr->super_SQObject)._type + lVar14))->
                    pTable;
            SVar3 = *(SQObjectType *)((long)pSVar5->_valptr + lVar14 + -8);
            if ((SVar3 >> 0x1b & 1) != 0) {
              pSVar1 = &((SVar7.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                        _uiRef;
              *pSVar1 = *pSVar1 + 1;
            }
            uVar10 = local_38.super_SQObject._type >> 0x1b;
            local_38.super_SQObject._type = SVar3;
            if ((uVar10 & 1) != 0) {
              pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).
                        super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 - 1;
              if (*pSVar1 == 0) {
                pSVar11 = &(local_38.super_SQObject._unVal.pTable)->super_SQDelegable;
                local_38.super_SQObject._unVal = SVar7;
                (*(pSVar11->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
                SVar7 = local_38.super_SQObject._unVal;
              }
            }
            local_38.super_SQObject._unVal = SVar7;
            pSVar8 = pSVar5->_valptr;
            uVar10 = *(uint *)((long)pSVar8 + lVar14 + -8);
            plVar9 = *(long **)((long)&(pSVar8->super_SQObject)._type + lVar14);
            *(undefined8 *)((long)&(pSVar8->super_SQObject)._type + lVar14) =
                 *(undefined8 *)((long)&(pSVar8->super_SQObject)._type + lVar15);
            uVar4 = *(uint *)((long)pSVar8 + lVar15 + -8);
            *(uint *)((long)pSVar8 + lVar14 + -8) = uVar4;
            if ((uVar4 >> 0x1b & 1) != 0) {
              plVar2 = (long *)(*(long *)((long)&(pSVar8->super_SQObject)._type + lVar14) + 8);
              *plVar2 = *plVar2 + 1;
            }
            if ((uVar10 >> 0x1b & 1) != 0) {
              plVar2 = plVar9 + 1;
              *plVar2 = *plVar2 + -1;
              if (*plVar2 == 0) {
                (**(code **)(*plVar9 + 0x10))();
              }
            }
            pSVar8 = pSVar5->_valptr;
            uVar10 = *(uint *)((long)pSVar8 + lVar15 + -8);
            plVar9 = *(long **)((long)&(pSVar8->super_SQObject)._type + lVar15);
            ((SQObjectValue *)((long)&(pSVar8->super_SQObject)._type + lVar15))->pTable =
                 (SQTable *)local_38.super_SQObject._unVal;
            *(SQObjectType *)((long)pSVar8 + lVar15 + -8) = local_38.super_SQObject._type;
            if ((local_38.super_SQObject._type >> 0x1b & 1) != 0) {
              plVar2 = (long *)(*(long *)((long)&(pSVar8->super_SQObject)._type + lVar15) + 8);
              *plVar2 = *plVar2 + 1;
            }
            if ((uVar10 >> 0x1b & 1) != 0) {
              plVar2 = plVar9 + 1;
              *plVar2 = *plVar2 + -1;
              if (*plVar2 == 0) {
                (**(code **)(*plVar9 + 0x10))();
              }
            }
            lVar15 = lVar15 + -0x10;
            lVar14 = lVar14 + 0x10;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        SQObjectPtr::~SQObjectPtr(&local_38);
      }
      SVar13 = 0;
    }
  }
  else {
    SQVM::Raise_Error(v,"not enough params in the stack");
    SVar13 = -1;
  }
  return SVar13;
}

Assistant:

SQRESULT sq_arrayreverse(HSQUIRRELVM v,SQInteger idx)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *o;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,o);
    SQArray *arr = _array(*o);
    if(arr->Size() > 0) {
        SQObjectPtr t;
        SQInteger size = arr->Size();
        SQInteger n = size >> 1; size -= 1;
        for(SQInteger i = 0; i < n; i++) {
            t = arr->_values[i];
            arr->_values[i] = arr->_values[size-i];
            arr->_values[size-i] = t;
        }
        return SQ_OK;
    }
    return SQ_OK;
}